

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::TextureVkImpl::InitializeContentOnHost
          (TextureVkImpl *this,TextureData *InitData,TextureFormatAttribs *FmtAttribs,
          VkImageCreateInfo *ImageCI)

{
  TextureDesc *TexDesc;
  VulkanLogicalDevice *this_00;
  ulong uVar1;
  byte bVar2;
  uint32_t uVar3;
  VkImageLayout VVar4;
  RESOURCE_STATE RVar5;
  RenderDeviceVkImpl *pRVar6;
  VkImageCreateInfo *pVVar7;
  uint uVar8;
  Uint32 MipLevel;
  pointer pVVar9;
  TextureSubResData *pTVar10;
  bool bVar11;
  bool bVar12;
  char (*in_stack_ffffffffffffff08) [45];
  Uint32 subres;
  VkImageAspectFlags local_e4;
  VkImageLayout Layout;
  Uint32 PixelSize;
  Uint32 ExpectedNumSubresources;
  VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo;
  vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_> vkCopyRegions;
  VkCopyMemoryToImageInfoEXT vkCopyInfo;
  
  pVVar7 = ImageCI;
  pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = (pRVar6->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((this_00->m_EnabledExtFeatures).HostImageCopy.hostImageCopy == 0) {
    FormatString<char[26],char[66]>
              ((string *)&vkLayoutTransitionInfo,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy",
               (char (*) [66])pVVar7);
    DebugAssertionFailed
              ((Char *)vkLayoutTransitionInfo._0_8_,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14b);
    if ((VkImage *)vkLayoutTransitionInfo._0_8_ != &vkLayoutTransitionInfo.image) {
      operator_delete((void *)vkLayoutTransitionInfo._0_8_,(ulong)(vkLayoutTransitionInfo.image + 1)
                     );
    }
  }
  ExpectedNumSubresources = ImageCI->arrayLayers * ImageCI->mipLevels;
  if (InitData->NumSubresources != ExpectedNumSubresources) {
    LogError<true,char[48],unsigned_int,char[18],unsigned_int,char[10]>
              (false,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x14f,(char (*) [48])"Incorrect number of subresources in init data. ",
               &ExpectedNumSubresources,(char (*) [18])" expected, while ",
               &InitData->NumSubresources,(char (*) [10])0x81744d);
  }
  if (FmtAttribs->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[63]>
              ((string *)&vkLayoutTransitionInfo,
               (char (*) [63])"Initializing depth-stencil texture is currently not supported.");
    DebugAssertionFailed
              ((Char *)vkLayoutTransitionInfo._0_8_,"InitializeContentOnHost",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x151);
    if ((VkImage *)vkLayoutTransitionInfo._0_8_ != &vkLayoutTransitionInfo.image) {
      operator_delete((void *)vkLayoutTransitionInfo._0_8_,(ulong)(vkLayoutTransitionInfo.image + 1)
                     );
    }
  }
  local_e4 = ComponentTypeToVkAspectMask(FmtAttribs->ComponentType);
  std::vector<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>::vector
            (&vkCopyRegions,(ulong)InitData->NumSubresources,
             (allocator_type *)&vkLayoutTransitionInfo);
  subres = 0;
  bVar12 = ImageCI->arrayLayers == 0;
  pVVar7 = ImageCI;
  if (!bVar12) {
    TexDesc = &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               .m_Desc;
    uVar8 = 0;
    do {
      if (ImageCI->mipLevels != 0) {
        MipLevel = 0;
        ImageCI = pVVar7;
        do {
          pTVar10 = InitData->pSubResources + subres;
          pVVar9 = vkCopyRegions.
                   super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
                   _M_impl.super__Vector_impl_data._M_start + subres;
          GetMipLevelProperties((MipLevelProperties *)&vkLayoutTransitionInfo,TexDesc,MipLevel);
          pVVar9->sType = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY;
          pVVar9->pNext = (void *)0x0;
          pVVar9->pHostPointer = pTVar10->pData;
          bVar2 = FmtAttribs->NumComponents;
          if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
            bVar2 = 1;
          }
          PixelSize = (uint)bVar2 * (uint)FmtAttribs->ComponentSize;
          uVar1 = pTVar10->Stride;
          uVar3 = (uint32_t)(uVar1 / PixelSize);
          if (uVar1 % (ulong)PixelSize != 0) {
            FormatString<char[31],char_const*,char[24],unsigned_int,char[13],unsigned_long,char[37],unsigned_int,char[45]>
                      ((string *)&vkCopyInfo,(Diligent *)"Unable to initialize texture \'",
                       (char (*) [31])TexDesc,(char **)"\' on host: subresource ",
                       (char (*) [24])&subres,(uint *)" has stride ",(char (*) [13])&pTVar10->Stride
                       ,(unsigned_long *)" that is not multiple of pixel size ",
                       (char (*) [37])&PixelSize,
                       (uint *)". The content will be initialized on device.",
                       in_stack_ffffffffffffff08);
            pVVar7 = ImageCI;
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,vkCopyInfo._0_8_,0,0,0);
            }
LAB_002446b7:
            if ((VkHostImageCopyFlags *)vkCopyInfo._0_8_ != &vkCopyInfo.flags) {
              operator_delete((void *)vkCopyInfo._0_8_,vkCopyInfo._16_8_ + 1);
            }
            if (!bVar12) goto LAB_002447d0;
            goto LAB_002446e2;
          }
          if (FmtAttribs->ComponentType == COMPONENT_TYPE_COMPRESSED) {
            uVar3 = (uint32_t)((FmtAttribs->BlockWidth * uVar1) / (ulong)FmtAttribs->ComponentSize);
          }
          pVVar9->memoryRowLength = uVar3;
          if (pTVar10->DepthStride % uVar1 != 0) {
            FormatString<char[31],char_const*,char[24],unsigned_int,char[19],unsigned_long,char[37],unsigned_long,char[45]>
                      ((string *)&vkCopyInfo,(Diligent *)"Unable to initialize texture \'",
                       (char (*) [31])TexDesc,(char **)"\' on host: subresource ",
                       (char (*) [24])&subres,(uint *)" has depth stride ",
                       (char (*) [19])&pTVar10->DepthStride,
                       (unsigned_long *)" that is not multiple of row stride ",
                       (char (*) [37])&pTVar10->Stride,
                       (unsigned_long *)". The content will be initialized on device.",
                       in_stack_ffffffffffffff08);
            pVVar7 = ImageCI;
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,vkCopyInfo._0_8_,0,0,0);
            }
            goto LAB_002446b7;
          }
          pVVar9->memoryImageHeight =
               (uint32_t)((pTVar10->DepthStride * (ulong)FmtAttribs->BlockHeight) / uVar1);
          (pVVar9->imageSubresource).aspectMask = local_e4;
          (pVVar9->imageSubresource).mipLevel = MipLevel;
          (pVVar9->imageSubresource).baseArrayLayer = uVar8;
          *(undefined8 *)&(pVVar9->imageSubresource).layerCount = 1;
          (pVVar9->imageOffset).y = 0;
          (pVVar9->imageOffset).z = 0;
          (pVVar9->imageExtent).width = vkLayoutTransitionInfo.sType;
          (pVVar9->imageExtent).height = vkLayoutTransitionInfo._4_4_;
          (pVVar9->imageExtent).depth = (uint32_t)vkLayoutTransitionInfo.image;
          subres = subres + 1;
          MipLevel = MipLevel + 1;
          pVVar7 = ImageCI;
        } while (MipLevel < ImageCI->mipLevels);
      }
      uVar8 = uVar8 + 1;
      bVar11 = uVar8 < ImageCI->arrayLayers;
      bVar12 = !bVar11;
    } while (bVar11);
  }
LAB_002446e2:
  Layout = (VkImageLayout)((ulong)pVVar7 >> 0x20);
  vkLayoutTransitionInfo.pNext = (void *)0x0;
  vkLayoutTransitionInfo.subresourceRange.aspectMask = 0;
  vkLayoutTransitionInfo.subresourceRange.baseMipLevel = 0;
  vkLayoutTransitionInfo.subresourceRange.levelCount = 0;
  vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
  vkLayoutTransitionInfo.subresourceRange.layerCount = 0;
  vkLayoutTransitionInfo._52_4_ = 0;
  vkLayoutTransitionInfo.sType = VK_STRUCTURE_TYPE_HOST_IMAGE_LAYOUT_TRANSITION_INFO;
  vkLayoutTransitionInfo._4_4_ = 0;
  vkLayoutTransitionInfo.image = (this->m_VulkanImage).m_VkObject;
  vkLayoutTransitionInfo.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  vkLayoutTransitionInfo.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  VVar4 = anon_unknown_102::VkImageLayoutFromUsage(ImageCI->usage);
  vkLayoutTransitionInfo.newLayout = VVar4;
  vkLayoutTransitionInfo.subresourceRange.aspectMask = local_e4;
  vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
  vkLayoutTransitionInfo.subresourceRange.layerCount = 0xffffffff;
  vkLayoutTransitionInfo.subresourceRange.baseMipLevel = 0;
  vkLayoutTransitionInfo.subresourceRange.levelCount = 0xffffffff;
  VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout(this_00,&vkLayoutTransitionInfo);
  vkCopyInfo.sType = VK_STRUCTURE_TYPE_COPY_MEMORY_TO_IMAGE_INFO;
  vkCopyInfo._4_4_ = 0;
  vkCopyInfo.pNext = (void *)0x0;
  vkCopyInfo.flags = 0;
  vkCopyInfo._20_4_ = 0;
  vkCopyInfo.dstImage = (this->m_VulkanImage).m_VkObject;
  vkCopyInfo.regionCount =
       (int)((ulong)((long)vkCopyRegions.
                           super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vkCopyRegions.
                          super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  vkCopyInfo.dstImageLayout = vkLayoutTransitionInfo.newLayout;
  vkCopyInfo.pRegions =
       vkCopyRegions.super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
       _M_impl.super__Vector_impl_data._M_start;
  VulkanUtilities::VulkanLogicalDevice::CopyMemoryToImage(this_00,&vkCopyInfo);
  RVar5 = VkImageLayoutToResourceState(Layout);
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RVar5;
LAB_002447d0:
  if (vkCopyRegions.super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkCopyRegions.
                    super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkCopyRegions.
                          super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkCopyRegions.
                          super__Vector_base<VkMemoryToImageCopy,_std::allocator<VkMemoryToImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool TextureVkImpl::InitializeContentOnHost(const TextureData&          InitData,
                                            const TextureFormatAttribs& FmtAttribs,
                                            const VkImageCreateInfo&    ImageCI) noexcept(false)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    VERIFY_EXPR(LogicalDevice.GetEnabledExtFeatures().HostImageCopy.hostImageCopy);

    Uint32 ExpectedNumSubresources = ImageCI.mipLevels * ImageCI.arrayLayers;
    if (InitData.NumSubresources != ExpectedNumSubresources)
        LOG_ERROR_AND_THROW("Incorrect number of subresources in init data. ", ExpectedNumSubresources, " expected, while ", InitData.NumSubresources, " provided");

    VERIFY(FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL, "Initializing depth-stencil texture is currently not supported.");
    const VkImageAspectFlags aspectMask = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

    std::vector<VkMemoryToImageCopyEXT> vkCopyRegions(InitData.NumSubresources);

    Uint32 subres = 0;
    for (Uint32 layer = 0; layer < ImageCI.arrayLayers; ++layer)
    {
        for (Uint32 mip = 0; mip < ImageCI.mipLevels; ++mip)
        {
            const TextureSubResData& SubResData = InitData.pSubResources[subres];
            VkMemoryToImageCopyEXT&  vkCopyInfo = vkCopyRegions[subres];
            MipLevelProperties       MipInfo    = GetMipLevelProperties(m_Desc, mip);

            vkCopyInfo.sType        = VK_STRUCTURE_TYPE_MEMORY_TO_IMAGE_COPY_EXT;
            vkCopyInfo.pNext        = nullptr;
            vkCopyInfo.pHostPointer = SubResData.pData;

            const Uint32 PixelSize = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                Uint32{FmtAttribs.ComponentSize} :
                Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
            if ((SubResData.Stride % PixelSize) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has stride ", SubResData.Stride,
                                        " that is not multiple of pixel size ", PixelSize, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryRowLength = FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED ?
                static_cast<uint32_t>(SubResData.Stride * FmtAttribs.BlockWidth / FmtAttribs.ComponentSize) :
                static_cast<uint32_t>(SubResData.Stride / PixelSize);

            if ((SubResData.DepthStride % SubResData.Stride) != 0)
            {
                LOG_DVP_WARNING_MESSAGE("Unable to initialize texture '", m_Desc.Name, "' on host: subresource ", subres, " has depth stride ", SubResData.DepthStride,
                                        " that is not multiple of row stride ", SubResData.Stride, ". The content will be initialized on device.");
                return false;
            }
            vkCopyInfo.memoryImageHeight = static_cast<uint32_t>(SubResData.DepthStride * FmtAttribs.BlockHeight / SubResData.Stride);

            vkCopyInfo.imageSubresource.aspectMask     = aspectMask;
            vkCopyInfo.imageSubresource.mipLevel       = mip;
            vkCopyInfo.imageSubresource.baseArrayLayer = layer;
            vkCopyInfo.imageSubresource.layerCount     = 1;

            vkCopyInfo.imageOffset = {0, 0, 0};
            vkCopyInfo.imageExtent = {MipInfo.LogicalWidth, MipInfo.LogicalHeight, MipInfo.Depth};

            ++subres;
        }
    }

    VkHostImageLayoutTransitionInfoEXT vkLayoutTransitionInfo{};
    vkLayoutTransitionInfo.sType     = VK_STRUCTURE_TYPE_HOST_IMAGE_LAYOUT_TRANSITION_INFO_EXT;
    vkLayoutTransitionInfo.image     = m_VulkanImage;
    vkLayoutTransitionInfo.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    vkLayoutTransitionInfo.newLayout = VkImageLayoutFromUsage(ImageCI.usage);

    vkLayoutTransitionInfo.subresourceRange.aspectMask     = aspectMask;
    vkLayoutTransitionInfo.subresourceRange.baseArrayLayer = 0;
    vkLayoutTransitionInfo.subresourceRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
    vkLayoutTransitionInfo.subresourceRange.baseMipLevel   = 0;
    vkLayoutTransitionInfo.subresourceRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    LogicalDevice.HostTransitionImageLayout(vkLayoutTransitionInfo);

    VkCopyMemoryToImageInfoEXT vkCopyInfo{};
    vkCopyInfo.sType          = VK_STRUCTURE_TYPE_COPY_MEMORY_TO_IMAGE_INFO_EXT;
    vkCopyInfo.pNext          = nullptr;
    vkCopyInfo.flags          = 0;
    vkCopyInfo.dstImage       = m_VulkanImage;
    vkCopyInfo.dstImageLayout = vkLayoutTransitionInfo.newLayout;
    vkCopyInfo.regionCount    = static_cast<uint32_t>(vkCopyRegions.size());
    vkCopyInfo.pRegions       = vkCopyRegions.data();

    LogicalDevice.CopyMemoryToImage(vkCopyInfo);

    SetState(VkImageLayoutToResourceState(vkCopyInfo.dstImageLayout));

    return true;
}